

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

void lj_dispatch_init_hotcount(global_State *g)

{
  uint32_t uVar1;
  uint32_t i;
  HotCount *hotcount;
  HotCount start;
  int32_t hotloop;
  global_State *g_local;
  
  uVar1 = g[3].gcroot[0xd].gcptr32;
  for (i = 0; i < 0x40; i = i + 1) {
    *(short *)((long)&g[5].strempty.hash + (ulong)i * 2) = (short)(uVar1 << 1) + -1;
  }
  return;
}

Assistant:

void lj_dispatch_init_hotcount(global_State *g)
{
  int32_t hotloop = G2J(g)->param[JIT_P_hotloop];
  HotCount start = (HotCount)(hotloop*HOTCOUNT_LOOP - 1);
  HotCount *hotcount = G2GG(g)->hotcount;
  uint32_t i;
  for (i = 0; i < HOTCOUNT_SIZE; i++)
    hotcount[i] = start;
}